

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall
Printer_printComponentWithMultipleFullyQualifiedMathDocuments_Test::TestBody
          (Printer_printComponentWithMultipleFullyQualifiedMathDocuments_Test *this)

{
  char *pcVar1;
  AssertHelper local_f0 [8];
  string e;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ModelPtr model;
  PrinterPtr printer;
  ParserPtr parser;
  string math2;
  string math1;
  string in;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\'1.0\'?>\n<model name=\"multiple_math_in_component\"\n    xmlns=\"http://www.cellml.org/cellml/2.0#\"\n    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n    <component name=\"environment\">\n        <variable name=\"nK_stim\" units=\"dimensionless\"/>\n        <variable name=\"stimPeriod\" units=\"second\"/>\n    </component>\n</model>\n"
             ,(allocator<char> *)&math1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&math1,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<math\n    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n    <apply>\n        <eq/>\n        <ci>nK_stim</ci>\n        <cn cellml:units=\"dimensionless\">0.3</cn>\n    </apply>\n</math>\n"
             ,(allocator<char> *)&math2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&math2,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<math\n    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n    <apply>\n        <eq/>\n        <ci>stimPeriod</ci>\n        <cn cellml:units=\"second\">42.6</cn>\n    </apply>\n</math>\n"
             ,(allocator<char> *)&e);
  libcellml::Printer::create();
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  libcellml::ComponentEntity::component((ulong)&e);
  libcellml::Component::appendMath((string *)e._M_dataplus._M_p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&e._M_string_length);
  libcellml::ComponentEntity::component((ulong)&e);
  libcellml::Component::appendMath((string *)e._M_dataplus._M_p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&e._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"printer/component_with_multiple_math.cellml",
             (allocator<char> *)&gtest_ar);
  fileContents((string *)&e);
  std::__cxx11::string::~string((string *)&local_b8);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_b8,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","printer->printModel(model)",&e,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x40f,pcVar1);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&e);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::string::~string((string *)&math2);
  std::__cxx11::string::~string((string *)&math1);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Printer, printComponentWithMultipleFullyQualifiedMathDocuments)
{
    const std::string in =
        "<?xml version='1.0'?>\n"
        "<model name=\"multiple_math_in_component\"\n"
        "    xmlns=\"http://www.cellml.org/cellml/2.0#\"\n"
        "    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "    <component name=\"environment\">\n"
        "        <variable name=\"nK_stim\" units=\"dimensionless\"/>\n"
        "        <variable name=\"stimPeriod\" units=\"second\"/>\n"
        "    </component>\n"
        "</model>\n";

    const std::string math1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<math\n"
        "    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n"
        "    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "    <apply>\n"
        "        <eq/>\n"
        "        <ci>nK_stim</ci>\n"
        "        <cn cellml:units=\"dimensionless\">0.3</cn>\n"
        "    </apply>\n"
        "</math>\n";

    const std::string math2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<math\n"
        "    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n"
        "    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "    <apply>\n"
        "        <eq/>\n"
        "        <ci>stimPeriod</ci>\n"
        "        <cn cellml:units=\"second\">42.6</cn>\n"
        "    </apply>\n"
        "</math>\n";

    auto printer = libcellml::Printer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(in);

    model->component(0)->appendMath(math1);
    model->component(0)->appendMath(math2);

    const std::string e = fileContents("printer/component_with_multiple_math.cellml");
    EXPECT_EQ(e, printer->printModel(model));
}